

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

void Gia_ManHashAlloc(Gia_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if ((p->vHTable).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->vHTable) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x6b,"void Gia_ManHashAlloc(Gia_Man_t *)");
  }
  iVar3 = ~(p->vCos->nSize + p->vCis->nSize) + p->nObjs;
  if (iVar3 == 0) {
    iVar3 = p->nObjsAlloc;
  }
  else {
    iVar3 = iVar3 + 1000;
  }
  uVar4 = iVar3 - 1;
  while( true ) {
    do {
      uVar5 = uVar4;
      uVar4 = uVar5 + 1;
    } while ((uVar5 & 1) != 0);
    if (uVar4 < 9) break;
    iVar3 = 5;
    while( true ) {
      if (uVar4 % (iVar3 - 2U) == 0) break;
      uVar1 = iVar3 * iVar3;
      iVar3 = iVar3 + 2;
      if (uVar4 < uVar1) goto LAB_002096d2;
    }
  }
LAB_002096d2:
  if ((p->vHTable).nCap < (int)uVar4) {
    piVar2 = (p->vHTable).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)(int)uVar4 << 2);
    }
    (p->vHTable).pArray = piVar2;
    if (piVar2 == (int *)0x0) goto LAB_002097b7;
    (p->vHTable).nCap = uVar4;
  }
  if (uVar5 < 0x7fffffff) {
    memset((p->vHTable).pArray,0,(ulong)uVar4 << 2);
  }
  (p->vHTable).nSize = uVar4;
  uVar5 = p->nObjs;
  if (p->nObjs < (int)uVar4) {
    uVar5 = uVar4;
  }
  if ((p->vHash).nCap < (int)uVar5) {
    piVar2 = (p->vHash).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)(int)uVar5 << 2);
    }
    (p->vHash).pArray = piVar2;
    if (piVar2 == (int *)0x0) goto LAB_002097b7;
    (p->vHash).nCap = uVar5;
  }
  uVar4 = p->nObjs;
  if ((p->vHash).nCap < (int)uVar4) {
    piVar2 = (p->vHash).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)(int)uVar4 << 2);
    }
    (p->vHash).pArray = piVar2;
    if (piVar2 == (int *)0x0) {
LAB_002097b7:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vHash).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p->vHash).pArray,0,(ulong)uVar4 * 4);
  }
  (p->vHash).nSize = uVar4;
  return;
}

Assistant:

void Gia_ManHashAlloc( Gia_Man_t * p )  
{
    assert( Vec_IntSize(&p->vHTable) == 0 );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( Gia_ManAndNum(p) ? Gia_ManAndNum(p) + 1000 : p->nObjsAlloc ), 0 );
    Vec_IntGrow( &p->vHash, Abc_MaxInt(Vec_IntSize(&p->vHTable), Gia_ManObjNum(p)) );
    Vec_IntFill( &p->vHash, Gia_ManObjNum(p), 0 );
//printf( "Alloced table with %d entries.\n", Vec_IntSize(&p->vHTable) );
}